

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char,std::__cxx11::string_const&,char>
                   (string *__return_storage_ptr__,char *a,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,char *args)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_120;
  cmAlphaNum local_e8;
  cmAlphaNum local_b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_78;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  local_e8.Digits_[0] = *a;
  local_e8.View_._M_str = local_e8.Digits_;
  local_e8.RValueString_ = (string *)0x0;
  local_e8.View_._M_len = 1;
  local_78.first = cmAlphaNum::View(&local_e8);
  local_78.second = local_e8.RValueString_;
  local_b0.RValueString_ = (string *)0x0;
  local_b0.View_._M_str = (b->_M_dataplus)._M_p;
  local_b0.View_._M_len = b->_M_string_length;
  local_60 = cmAlphaNum::View(&local_b0);
  local_50 = local_b0.RValueString_;
  local_120.Digits_[0] = *args;
  local_120.View_._M_str = local_120.Digits_;
  local_120.RValueString_ = (string *)0x0;
  local_120.View_._M_len = 1;
  local_48 = cmAlphaNum::View(&local_120);
  local_38 = local_120.RValueString_;
  views._M_len = 3;
  views._M_array = &local_78;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}